

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.h
# Opt level: O0

Node<MeshLib::Vertex> * __thiscall
AVL::Node<MeshLib::Vertex>::remove_node(Node<MeshLib::Vertex> *this,Vertex *inData)

{
  bool bVar1;
  Node<MeshLib::Vertex> *pNVar2;
  Node<MeshLib::Vertex> *tmp;
  Vertex *inData_local;
  Node<MeshLib::Vertex> *this_local;
  
  if (this == (Node<MeshLib::Vertex> *)0x0) {
    this_local = (Node<MeshLib::Vertex> *)0x0;
  }
  else {
    bVar1 = MeshLib::Vertex::operator==(inData,this->data);
    if (bVar1) {
      this_local = move_down_righthand_side(this->left,this->right);
      this->left = (Node<MeshLib::Vertex> *)0x0;
      this->right = (Node<MeshLib::Vertex> *)0x0;
      if (this != (Node<MeshLib::Vertex> *)0x0) {
        ~Node(this);
        operator_delete(this);
      }
    }
    else {
      bVar1 = MeshLib::Vertex::operator<(inData,this->data);
      if (bVar1) {
        pNVar2 = remove_node(this->left,inData);
        this->left = pNVar2;
      }
      else {
        pNVar2 = remove_node(this->right,inData);
        this->right = pNVar2;
      }
      this_local = balance(this);
    }
  }
  return this_local;
}

Assistant:

Node<T> * remove_node (T * inData)
    {
        if (this == NULL)
            return NULL;

        // we found the data we were looking for

        if ( *inData == *data)
        {
            // save the children

            Node<T> * tmp = left -> move_down_righthand_side (right);

            // by setting the children to NULL, we delete exactly one node.

            left = NULL;
            right = NULL;
            delete this;

            // return the reorganized children

            return tmp;
        }

        if ( *inData < *data)
            left = left -> remove_node (inData);
        else
            right = right -> remove_node (inData);
        return balance ();
    }